

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

any * Omega_h::anon_unknown_41::eval_pow(any *__return_storage_ptr__,Int dim,any *lhs,any *rhs)

{
  int *piVar1;
  char *pcVar2;
  ulong *puVar3;
  Alloc *pAVar4;
  bool bVar5;
  int iVar6;
  type_info *ptVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar8;
  undefined7 uVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  any *paVar9;
  any *extraout_RAX_02;
  undefined8 *puVar10;
  ParserFail *pPVar11;
  void *pvVar13;
  Reals local_68;
  Reals local_58;
  undefined1 local_48 [32];
  void *local_28;
  
  if (dim == 2) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar2 != '*' && (iVar6 = strcmp(pcVar2,"N7Omega_h4ReadIdEE"), iVar6 == 0)))) {
      bVar5 = any::is_typed(lhs,(type_info *)&Read<double>::typeinfo);
      if ((bVar5) && (puVar3 = (ulong *)(lhs->storage).dynamic, puVar3 != (ulong *)0x0)) {
        local_68.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        bVar5 = any::is_typed(rhs,(type_info *)&Read<double>::typeinfo);
        if ((!bVar5) || (puVar3 = (ulong *)(rhs->storage).dynamic, puVar3 == (ulong *)0x0)) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar10 = &PTR__bad_cast_004b86a8;
          __cxa_throw(puVar10,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        local_58.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.write_.shared_alloc_.alloc)->use_count =
                 (local_58.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_58.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        pow_each((Omega_h *)local_48,&local_68,&local_58);
        __return_storage_ptr__->vtable =
             (vtable_type *)any::vtable_for_type<Omega_h::Read<double>>()::table;
        any::do_construct<Omega_h::Read<double>,Omega_h::Read<double>>
                  (__return_storage_ptr__,(Read<double> *)local_48);
        uVar8 = extraout_RAX_00;
        goto LAB_002aa7b9;
      }
      goto LAB_002aa850;
    }
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 != _rfind) && ((*pcVar2 == '*' || (iVar6 = strcmp(pcVar2,_rfind), iVar6 != 0)))) {
      pPVar11 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Invalid right operand type in ^ operator","");
      ParserFail::ParserFail(pPVar11,(string *)local_48);
      __cxa_throw(pPVar11,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar5 = any::is_typed(lhs,(type_info *)&double::typeinfo);
    if (!bVar5) goto LAB_002aa850;
    local_28 = (lhs->storage).dynamic;
    bVar5 = any::is_typed(rhs,(type_info *)&double::typeinfo);
  }
  else if (dim == 3) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar2 != '*' && (iVar6 = strcmp(pcVar2,"N7Omega_h4ReadIdEE"), iVar6 == 0)))) {
      bVar5 = any::is_typed(lhs,(type_info *)&Read<double>::typeinfo);
      if ((bVar5) && (puVar3 = (ulong *)(lhs->storage).dynamic, puVar3 != (ulong *)0x0)) {
        local_68.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        bVar5 = any::is_typed(rhs,(type_info *)&Read<double>::typeinfo);
        if ((!bVar5) || (puVar3 = (ulong *)(rhs->storage).dynamic, puVar3 == (ulong *)0x0)) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar10 = &PTR__bad_cast_004b86a8;
          __cxa_throw(puVar10,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        local_58.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.write_.shared_alloc_.alloc)->use_count =
                 (local_58.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_58.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        pow_each((Omega_h *)local_48,&local_68,&local_58);
        __return_storage_ptr__->vtable =
             (vtable_type *)any::vtable_for_type<Omega_h::Read<double>>()::table;
        any::do_construct<Omega_h::Read<double>,Omega_h::Read<double>>
                  (__return_storage_ptr__,(Read<double> *)local_48);
        uVar8 = extraout_RAX;
LAB_002aa7b9:
        uVar12 = (undefined7)((ulong)uVar8 >> 8);
        if ((local_48._0_8_ & 7) == 0 && (Alloc *)local_48._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_48._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_48._0_8_);
            operator_delete((void *)local_48._0_8_,0x48);
            uVar12 = extraout_var;
          }
        }
        pAVar4 = local_58.write_.shared_alloc_.alloc;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
            uVar12 = extraout_var_00;
          }
        }
        pAVar4 = local_68.write_.shared_alloc_.alloc;
        paVar9 = (any *)CONCAT71(uVar12,local_68.write_.shared_alloc_.alloc == (Alloc *)0x0);
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) != 0 ||
            local_68.write_.shared_alloc_.alloc == (Alloc *)0x0) {
          return paVar9;
        }
        piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 != 0) {
          return paVar9;
        }
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        return extraout_RAX_02;
      }
      goto LAB_002aa850;
    }
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 != _rfind) && ((*pcVar2 == '*' || (iVar6 = strcmp(pcVar2,_rfind), iVar6 != 0)))) {
      pPVar11 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Invalid right operand type in ^ operator","");
      ParserFail::ParserFail(pPVar11,(string *)local_48);
      __cxa_throw(pPVar11,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar5 = any::is_typed(lhs,(type_info *)&double::typeinfo);
    if (!bVar5) goto LAB_002aa850;
    local_28 = (lhs->storage).dynamic;
    bVar5 = any::is_typed(rhs,(type_info *)&double::typeinfo);
  }
  else {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar2 != '*' && (iVar6 = strcmp(pcVar2,"N7Omega_h4ReadIdEE"), iVar6 == 0)))) {
      bVar5 = any::is_typed(lhs,(type_info *)&Read<double>::typeinfo);
      if ((bVar5) && (puVar3 = (ulong *)(lhs->storage).dynamic, puVar3 != (ulong *)0x0)) {
        local_68.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        bVar5 = any::is_typed(rhs,(type_info *)&Read<double>::typeinfo);
        if ((!bVar5) || (puVar3 = (ulong *)(rhs->storage).dynamic, puVar3 == (ulong *)0x0)) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar10 = &PTR__bad_cast_004b86a8;
          __cxa_throw(puVar10,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        local_58.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
        if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.write_.shared_alloc_.alloc)->use_count =
                 (local_58.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_58.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
        pow_each((Omega_h *)local_48,&local_68,&local_58);
        __return_storage_ptr__->vtable =
             (vtable_type *)any::vtable_for_type<Omega_h::Read<double>>()::table;
        any::do_construct<Omega_h::Read<double>,Omega_h::Read<double>>
                  (__return_storage_ptr__,(Read<double> *)local_48);
        uVar8 = extraout_RAX_01;
        goto LAB_002aa7b9;
      }
      goto LAB_002aa850;
    }
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if ((pcVar2 != _rfind) && ((*pcVar2 == '*' || (iVar6 = strcmp(pcVar2,_rfind), iVar6 != 0)))) {
      pPVar11 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Invalid right operand type in ^ operator","");
      ParserFail::ParserFail(pPVar11,(string *)local_48);
      __cxa_throw(pPVar11,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar5 = any::is_typed(lhs,(type_info *)&double::typeinfo);
    if (!bVar5) goto LAB_002aa850;
    local_28 = (lhs->storage).dynamic;
    bVar5 = any::is_typed(rhs,(type_info *)&double::typeinfo);
  }
  if (bVar5 != false) {
    pvVar13 = (void *)pow((double)local_28,(double)(rhs->storage).dynamic);
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<double>()::table;
    (__return_storage_ptr__->storage).dynamic = pvVar13;
    return (any *)any::vtable_for_type<double>()::table;
  }
LAB_002aa850:
  puVar10 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar10 = &PTR__bad_cast_004b86a8;
  __cxa_throw(puVar10,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

any eval_pow(Int dim, any& lhs, any& rhs) {
  if (dim == 3) return eval_pow<3>(lhs, rhs);
  if (dim == 2) return eval_pow<2>(lhs, rhs);
  return eval_pow<1>(lhs, rhs);
}